

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void * map_get(Map *map,void *key)

{
  long *plVar1;
  
  if ((undefined8 *)map->elem[(ulong)key % (ulong)map->prime] != (undefined8 *)0x0) {
    for (plVar1 = *map->elem[(ulong)key % (ulong)map->prime]; plVar1 != (long *)0x0;
        plVar1 = (long *)plVar1[2]) {
      if (*(void **)*plVar1 == key) {
        return (void *)((long *)*plVar1)[1];
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *map_get(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            return elem->value;
        }
        node = node->next;
    }
    return NULL;
}